

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O2

Geometry * __thiscall
Rml::ElementBackgroundBorder::GetClipGeometry
          (ElementBackgroundBorder *this,Element *element,BoxArea clip_area)

{
  code *pcVar1;
  bool bVar2;
  RenderManager *mesh_00;
  Background *this_00;
  Mesh mesh;
  
  if (clip_area - Border < 3) {
    mesh_00 = Element::GetRenderManager(element);
    this_00 = GetOrCreateBackground(this,clip_area + Border);
    if ((mesh_00 != (RenderManager *)0x0) &&
       ((this_00->geometry).
        super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        .resource_handle == Invalid)) {
      Geometry::Release(&mesh,&this_00->geometry,ClearMesh);
      Element::GetRenderBox((RenderBox *)&stack0xffffffffffffffa8,element,clip_area,0);
      MeshUtilities::GenerateBackground
                (&mesh,(RenderBox *)&stack0xffffffffffffffa8,(ColourbPremultiplied)0xffffffff);
      RenderManager::MakeGeometry((RenderManager *)&stack0xffffffffffffffa8,(Mesh *)mesh_00);
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   *)this_00,
                  (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   *)&stack0xffffffffffffffa8);
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::~UniqueRenderResource
                ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                  *)&stack0xffffffffffffffa8);
      Mesh::~Mesh(&mesh);
    }
  }
  else {
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                   ,0x57);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_00 = (Background *)0x0;
  }
  return &this_00->geometry;
}

Assistant:

Geometry* ElementBackgroundBorder::GetClipGeometry(Element* element, BoxArea clip_area)
{
	BackgroundType type = {};
	switch (clip_area)
	{
	case Rml::BoxArea::Border: type = BackgroundType::ClipBorder; break;
	case Rml::BoxArea::Padding: type = BackgroundType::ClipPadding; break;
	case Rml::BoxArea::Content: type = BackgroundType::ClipContent; break;
	default: RMLUI_ERROR; return nullptr;
	}

	RenderManager* render_manager = element->GetRenderManager();
	Geometry& geometry = GetOrCreateBackground(type).geometry;
	if (render_manager && !geometry)
	{
		Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);
		MeshUtilities::GenerateBackground(mesh, element->GetRenderBox(clip_area), ColourbPremultiplied(255));
		geometry = render_manager->MakeGeometry(std::move(mesh));
	}

	return &geometry;
}